

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValue
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,int index,
          TextGenerator *generator)

{
  _Rb_tree_header *p_Var1;
  size_type *psVar2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  LogMessage *pLVar6;
  _Base_ptr p_Var7;
  unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  *puVar8;
  Message *message_00;
  uint64 uVar9;
  int64 iVar10;
  string *this_00;
  EnumDescriptor *this_01;
  EnumValueDescriptor *pEVar11;
  undefined8 *puVar12;
  long lVar13;
  int iVar14;
  _Base_ptr p_Var15;
  _func_void_FieldDescriptor_ptr *p_Var16;
  undefined4 uVar17;
  undefined1 local_e0 [8];
  string truncated_value;
  undefined1 local_b0 [16];
  undefined1 local_a0 [24];
  _Alloc_hider _Stack_88;
  undefined1 local_68 [8];
  string scratch;
  
  if ((index != -1) && (*(int *)(field + 0x3c) != 3)) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/text_format.cc"
               ,0x910);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)local_a0,
                        "CHECK failed: field->is_repeated() || (index == -1): ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,"Index must be -1 for non-repeated fields");
    internal::LogFinisher::operator=((LogFinisher *)local_68,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)local_a0);
  }
  p_Var15 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var15 == (_Base_ptr)0x0) {
LAB_002eea27:
    puVar8 = &this->default_field_value_printer_;
  }
  else {
    p_Var1 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      if (*(FieldDescriptor **)(p_Var15 + 1) >= field) {
        p_Var7 = p_Var15;
      }
      p_Var15 = (&p_Var15->_M_left)[*(FieldDescriptor **)(p_Var15 + 1) < field];
    } while (p_Var15 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 == p_Var1) || (field < *(FieldDescriptor **)(p_Var7 + 1)))
    goto LAB_002eea27;
    puVar8 = (unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
              *)&p_Var7[1]._M_parent;
  }
  p_Var15 = (_Base_ptr)
            (puVar8->_M_t).
            super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
            .
            super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>
            ._M_head_impl;
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_a0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_68 = (undefined1  [8])field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_a0,
               (FieldDescriptor **)local_68);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    if (*(int *)(field + 0x3c) == 3) {
      uVar5 = Reflection::GetRepeatedInt32(reflection,message,field,index);
    }
    else {
      uVar5 = Reflection::GetInt32(reflection,message,field);
    }
    (**(code **)(*(long *)&p_Var15->_M_color + 0x18))(p_Var15,(ulong)uVar5,generator);
    break;
  case 2:
    if (*(int *)(field + 0x3c) == 3) {
      iVar10 = Reflection::GetRepeatedInt64(reflection,message,field,index);
    }
    else {
      iVar10 = Reflection::GetInt64(reflection,message,field);
    }
    (**(code **)(*(long *)&p_Var15->_M_color + 0x28))(p_Var15,iVar10,generator);
    break;
  case 3:
    if (*(int *)(field + 0x3c) == 3) {
      uVar5 = Reflection::GetRepeatedUInt32(reflection,message,field,index);
    }
    else {
      uVar5 = Reflection::GetUInt32(reflection,message,field);
    }
    (**(code **)(*(long *)&p_Var15->_M_color + 0x20))(p_Var15,(ulong)uVar5,generator);
    break;
  case 4:
    if (*(int *)(field + 0x3c) == 3) {
      uVar9 = Reflection::GetRepeatedUInt64(reflection,message,field,index);
    }
    else {
      uVar9 = Reflection::GetUInt64(reflection,message,field);
    }
    (**(code **)(*(long *)&p_Var15->_M_color + 0x30))(p_Var15,uVar9,generator);
    break;
  case 5:
    if (*(int *)(field + 0x3c) == 3) {
      dVar3 = Reflection::GetRepeatedDouble(reflection,message,field,index);
      uVar17 = SUB84(dVar3,0);
    }
    else {
      dVar3 = Reflection::GetDouble(reflection,message,field);
      uVar17 = SUB84(dVar3,0);
    }
    (**(code **)(*(long *)&p_Var15->_M_color + 0x40))(uVar17,p_Var15,generator);
    break;
  case 6:
    if (*(int *)(field + 0x3c) == 3) {
      Reflection::GetRepeatedFloat(reflection,message,field,index);
    }
    else {
      Reflection::GetFloat(reflection,message,field);
    }
    (**(code **)(*(long *)&p_Var15->_M_color + 0x38))(p_Var15,generator);
    break;
  case 7:
    if (*(int *)(field + 0x3c) == 3) {
      bVar4 = Reflection::GetRepeatedBool(reflection,message,field,index);
    }
    else {
      bVar4 = Reflection::GetBool(reflection,message,field);
    }
    (**(code **)(*(long *)&p_Var15->_M_color + 0x10))(p_Var15,(ulong)bVar4,generator);
    break;
  case 8:
    if (*(int *)(field + 0x3c) == 3) {
      uVar5 = Reflection::GetRepeatedEnumValue(reflection,message,field,index);
    }
    else {
      uVar5 = Reflection::GetEnumValue(reflection,message,field);
    }
    this_01 = FieldDescriptor::enum_type(field);
    pEVar11 = EnumDescriptor::FindValueByNumber(this_01,uVar5);
    if (pEVar11 != (EnumValueDescriptor *)0x0) {
      (**(code **)(*(long *)&p_Var15->_M_color + 0x58))
                (p_Var15,(ulong)uVar5,*(undefined8 *)pEVar11,generator);
      return;
    }
    p_Var16 = (_func_void_FieldDescriptor_ptr *)(local_a0 + 0x10);
    local_a0._0_8_ = p_Var16;
    local_a0._8_8_ = FastInt32ToBufferLeft(uVar5,(char *)p_Var16);
    local_a0._8_8_ = local_a0._8_8_ + -(long)p_Var16;
    local_68 = (undefined1  [8])&scratch._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,local_a0._0_8_,(char *)(local_a0._8_8_ + local_a0._0_8_));
    (**(code **)(*(long *)&p_Var15->_M_color + 0x58))
              (p_Var15,(ulong)uVar5,(string *)local_68,generator);
    if (local_68 == (undefined1  [8])&scratch._M_string_length) {
      return;
    }
    goto LAB_002eef86;
  case 9:
    local_68 = (undefined1  [8])&scratch._M_string_length;
    scratch._M_dataplus._M_p = (pointer)0x0;
    scratch._M_string_length._0_1_ = 0;
    if (*(int *)(field + 0x3c) == 3) {
      this_00 = Reflection::GetRepeatedStringReference
                          (reflection,message,field,index,(string *)local_68);
    }
    else {
      this_00 = Reflection::GetStringReference(reflection,message,field,(string *)local_68);
    }
    psVar2 = &truncated_value._M_string_length;
    truncated_value._M_dataplus._M_p = (pointer)0x0;
    truncated_value._M_string_length._0_1_ = 0;
    local_e0 = (undefined1  [8])psVar2;
    if ((0 < this->truncate_string_field_longer_than_) &&
       ((ulong)this->truncate_string_field_longer_than_ < this_00->_M_string_length)) {
      std::__cxx11::string::substr((ulong)((long)&truncated_value.field_2 + 8),(ulong)this_00);
      puVar12 = (undefined8 *)std::__cxx11::string::append(truncated_value.field_2._M_local_buf + 8)
      ;
      p_Var16 = (_func_void_FieldDescriptor_ptr *)(puVar12 + 2);
      if ((_func_void_FieldDescriptor_ptr *)*puVar12 == p_Var16) {
        local_a0._16_8_ = *(undefined8 *)p_Var16;
        _Stack_88._M_p = (pointer)puVar12[3];
        local_a0._0_8_ = local_a0 + 0x10;
      }
      else {
        local_a0._16_8_ = *(undefined8 *)p_Var16;
        local_a0._0_8_ = (_func_void_FieldDescriptor_ptr *)*puVar12;
      }
      local_a0._8_8_ = puVar12[1];
      *puVar12 = p_Var16;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      this_00 = (string *)local_e0;
      std::__cxx11::string::operator=((string *)this_00,(string *)local_a0);
      if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
        operator_delete((void *)local_a0._0_8_);
      }
      if ((undefined1 *)truncated_value.field_2._8_8_ != local_b0) {
        operator_delete((void *)truncated_value.field_2._8_8_);
      }
    }
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_a0._0_8_ = FieldDescriptor::TypeOnceInit;
      truncated_value.field_2._8_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_a0,
                 (FieldDescriptor **)((long)&truncated_value.field_2 + 8));
    }
    iVar14 = *(int *)(field + 0x38);
    lVar13 = 0x48;
    if (iVar14 != 9) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        local_a0._0_8_ = FieldDescriptor::TypeOnceInit;
        truncated_value.field_2._8_8_ = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_a0,
                   (FieldDescriptor **)((long)&truncated_value.field_2 + 8));
        iVar14 = *(int *)(field + 0x38);
      }
      if (iVar14 != 0xc) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/text_format.cc"
                   ,0x93a);
        pLVar6 = internal::LogMessage::operator<<
                           ((LogMessage *)local_a0,
                            "CHECK failed: (field->type()) == (FieldDescriptor::TYPE_BYTES): ");
        internal::LogFinisher::operator=((LogFinisher *)(scratch.field_2._M_local_buf + 0xf),pLVar6)
        ;
        internal::LogMessage::~LogMessage((LogMessage *)local_a0);
      }
      lVar13 = 0x50;
    }
    (**(code **)(*(long *)&p_Var15->_M_color + lVar13))(p_Var15,this_00,generator);
    if (local_e0 != (undefined1  [8])psVar2) {
      operator_delete((void *)local_e0);
    }
    if (local_68 == (undefined1  [8])&scratch._M_string_length) {
      return;
    }
LAB_002eef86:
    operator_delete((void *)local_68);
    break;
  case 10:
    if (*(int *)(field + 0x3c) == 3) {
      message_00 = Reflection::GetRepeatedMessage(reflection,message,field,index);
    }
    else {
      message_00 = Reflection::GetMessage(reflection,message,field,(MessageFactory *)0x0);
    }
    Print(this,message_00,generator);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValue(const Message& message,
                                          const Reflection* reflection,
                                          const FieldDescriptor* field,
                                          int index,
                                          TextGenerator* generator) const {
  GOOGLE_DCHECK(field->is_repeated() || (index == -1))
      << "Index must be -1 for non-repeated fields";

  const FastFieldValuePrinter* printer = GetFieldPrinter(field);

  switch (field->cpp_type()) {
#define OUTPUT_FIELD(CPPTYPE, METHOD)                                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                           \
    printer->Print##METHOD(                                          \
        field->is_repeated()                                         \
            ? reflection->GetRepeated##METHOD(message, field, index) \
            : reflection->Get##METHOD(message, field),               \
        generator);                                                  \
    break

    OUTPUT_FIELD(INT32, Int32);
    OUTPUT_FIELD(INT64, Int64);
    OUTPUT_FIELD(UINT32, UInt32);
    OUTPUT_FIELD(UINT64, UInt64);
    OUTPUT_FIELD(FLOAT, Float);
    OUTPUT_FIELD(DOUBLE, Double);
    OUTPUT_FIELD(BOOL, Bool);
#undef OUTPUT_FIELD

    case FieldDescriptor::CPPTYPE_STRING: {
      std::string scratch;
      const std::string& value =
          field->is_repeated()
              ? reflection->GetRepeatedStringReference(message, field, index,
                                                       &scratch)
              : reflection->GetStringReference(message, field, &scratch);
      const std::string* value_to_print = &value;
      std::string truncated_value;
      if (truncate_string_field_longer_than_ > 0 &&
          truncate_string_field_longer_than_ < value.size()) {
        truncated_value = value.substr(0, truncate_string_field_longer_than_) +
                          "...<truncated>...";
        value_to_print = &truncated_value;
      }
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        printer->PrintString(*value_to_print, generator);
      } else {
        GOOGLE_DCHECK_EQ(field->type(), FieldDescriptor::TYPE_BYTES);
        printer->PrintBytes(*value_to_print, generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_ENUM: {
      int enum_value =
          field->is_repeated()
              ? reflection->GetRepeatedEnumValue(message, field, index)
              : reflection->GetEnumValue(message, field);
      const EnumValueDescriptor* enum_desc =
          field->enum_type()->FindValueByNumber(enum_value);
      if (enum_desc != nullptr) {
        printer->PrintEnum(enum_value, enum_desc->name(), generator);
      } else {
        // Ordinarily, enum_desc should not be null, because proto2 has the
        // invariant that set enum field values must be in-range, but with the
        // new integer-based API for enums (or the RepeatedField<int> loophole),
        // it is possible for the user to force an unknown integer value.  So we
        // simply use the integer value itself as the enum value name in this
        // case.
        printer->PrintEnum(enum_value, StrCat(enum_value), generator);
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_MESSAGE:
      Print(field->is_repeated()
                ? reflection->GetRepeatedMessage(message, field, index)
                : reflection->GetMessage(message, field),
            generator);
      break;
  }
}